

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O2

void __thiscall
duckdb::HashJoinLocalSinkState::HashJoinLocalSinkState
          (HashJoinLocalSinkState *this,PhysicalHashJoin *op,ClientContext *context,
          HashJoinGlobalSinkState *gstate)

{
  atomic<unsigned_long> *paVar1;
  pointer pJVar2;
  vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_> *pvVar3;
  undefined8 uVar4;
  pointer this_00;
  HashJoinGlobalSinkState *pHVar5;
  Allocator *allocator;
  type expr;
  pointer pJVar6;
  type this_01;
  pointer pJVar7;
  PartitionedTupleDataAppendState *gstate_00;
  undefined1 local_70 [16];
  DataChunk *local_60;
  pointer local_58;
  PartitionedTupleDataAppendState *local_50;
  DataChunk *local_48;
  ClientContext *local_40;
  HashJoinGlobalSinkState *local_38;
  
  *(undefined4 *)&(this->super_LocalSinkState).partition_info.batch_index.index = 0xffffffff;
  *(undefined4 *)((long)&(this->super_LocalSinkState).partition_info.batch_index.index + 4) =
       0xffffffff;
  *(undefined4 *)&(this->super_LocalSinkState).partition_info.min_batch_index.index = 0xffffffff;
  *(undefined4 *)((long)&(this->super_LocalSinkState).partition_info.min_batch_index.index + 4) =
       0xffffffff;
  pvVar3 = &(this->super_LocalSinkState).partition_info.partition_data.
            super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>;
  (pvVar3->
  super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar3->
  super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_LocalSinkState).partition_info.partition_data.
           super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
           super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
           ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->super_LocalSinkState)._vptr_LocalSinkState =
       (_func_int **)&PTR__HashJoinLocalSinkState_027bb8b8;
  local_50 = &this->append_state;
  PartitionedTupleDataAppendState::PartitionedTupleDataAppendState(local_50);
  ExpressionExecutor::ExpressionExecutor(&this->join_key_executor,context);
  local_48 = &this->join_keys;
  DataChunk::DataChunk(local_48);
  local_60 = &this->payload_chunk;
  DataChunk::DataChunk(local_60);
  local_58 = (pointer)&this->hash_table;
  local_70._8_8_ = &this->local_filter_state;
  this->hash_table =
       (unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>_>)0x0;
  this->local_filter_state =
       (unique_ptr<duckdb::JoinFilterLocalState,_std::default_delete<duckdb::JoinFilterLocalState>_>
       )0x0;
  local_40 = context;
  allocator = BufferAllocator::Get(context);
  pJVar2 = (op->super_PhysicalComparisonJoin).conditions.
           super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
           super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl
           .super__Vector_impl_data._M_finish;
  local_38 = gstate;
  for (pJVar7 = (op->super_PhysicalComparisonJoin).conditions.
                super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
                super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
                _M_impl.super__Vector_impl_data._M_start; pJVar7 != pJVar2; pJVar7 = pJVar7 + 1) {
    expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (&pJVar7->right);
    ExpressionExecutor::AddExpression(&this->join_key_executor,expr);
  }
  DataChunk::Initialize(local_48,allocator,&op->condition_types,0x800);
  pHVar5 = local_38;
  if ((op->payload_columns).col_types.
      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (op->payload_columns).col_types.
      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    DataChunk::Initialize(local_60,allocator,&(op->payload_columns).col_types,0x800);
  }
  PhysicalHashJoin::InitializeHashTable((PhysicalHashJoin *)local_70,(ClientContext *)op);
  this_00 = local_58;
  uVar4 = local_70._0_8_;
  local_70._0_8_ =
       (__uniq_ptr_impl<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>_>)0x0;
  ::std::__uniq_ptr_impl<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>_>::reset
            ((__uniq_ptr_impl<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>_> *)
             local_58,(pointer)uVar4);
  ::std::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>_>::~unique_ptr
            ((unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>_> *)
             local_70);
  pJVar6 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
           operator->((unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>
                       *)this_00);
  this_01 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
            ::operator*(&pJVar6->sink_collection);
  gstate_00 = local_50;
  PartitionedTupleData::InitializeAppendState(this_01,local_50,UNPIN_AFTER_DONE);
  LOCK();
  paVar1 = &pHVar5->active_local_states;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  if ((op->super_PhysicalComparisonJoin).filter_pushdown.
      super_unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::JoinFilterPushdownInfo_*,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
      .super__Head_base<0UL,_duckdb::JoinFilterPushdownInfo_*,_false>._M_head_impl !=
      (JoinFilterPushdownInfo *)0x0) {
    unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>,_true>
    ::operator->(&(op->super_PhysicalComparisonJoin).filter_pushdown);
    unique_ptr<duckdb::JoinFilterGlobalState,_std::default_delete<duckdb::JoinFilterGlobalState>,_true>
    ::operator*(&pHVar5->global_filter_state);
    JoinFilterPushdownInfo::GetLocalState
              ((JoinFilterPushdownInfo *)local_70,(JoinFilterGlobalState *)gstate_00);
    uVar4 = local_70._0_8_;
    local_70._0_8_ =
         (__uniq_ptr_impl<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>_>)0x0;
    ::std::
    __uniq_ptr_impl<duckdb::JoinFilterLocalState,_std::default_delete<duckdb::JoinFilterLocalState>_>
    ::reset((__uniq_ptr_impl<duckdb::JoinFilterLocalState,_std::default_delete<duckdb::JoinFilterLocalState>_>
             *)local_70._8_8_,(pointer)uVar4);
    ::std::
    unique_ptr<duckdb::JoinFilterLocalState,_std::default_delete<duckdb::JoinFilterLocalState>_>::
    ~unique_ptr((unique_ptr<duckdb::JoinFilterLocalState,_std::default_delete<duckdb::JoinFilterLocalState>_>
                 *)local_70);
  }
  return;
}

Assistant:

HashJoinLocalSinkState(const PhysicalHashJoin &op, ClientContext &context, HashJoinGlobalSinkState &gstate)
	    : join_key_executor(context) {
		auto &allocator = BufferAllocator::Get(context);

		for (auto &cond : op.conditions) {
			join_key_executor.AddExpression(*cond.right);
		}
		join_keys.Initialize(allocator, op.condition_types);

		if (!op.payload_columns.col_types.empty()) {
			payload_chunk.Initialize(allocator, op.payload_columns.col_types);
		}

		hash_table = op.InitializeHashTable(context);
		hash_table->GetSinkCollection().InitializeAppendState(append_state);

		gstate.active_local_states++;

		if (op.filter_pushdown) {
			local_filter_state = op.filter_pushdown->GetLocalState(*gstate.global_filter_state);
		}
	}